

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_val_t * art_find(art_t *art,art_key_chunk_t *key)

{
  long *in_RDI;
  art_key_chunk_t *in_stack_00000010;
  art_node_t *in_stack_00000018;
  undefined8 local_8;
  
  if (*in_RDI == 0) {
    local_8 = (art_val_t *)0x0;
  }
  else {
    local_8 = art_find_at(in_stack_00000018,in_stack_00000010,art._7_1_);
  }
  return local_8;
}

Assistant:

art_val_t *art_find(const art_t *art, const art_key_chunk_t *key) {
    if (art->root == NULL) {
        return NULL;
    }
    return art_find_at(art->root, key, 0);
}